

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_threshold.hpp
# Opt level: O1

void re::math::threshold_reference<float,512l,512l,512l>
               (span<const_float,_512L> in,span<float,_512L> out,span<float,_512L> thresh,
               int_t radius)

{
  math *pmVar1;
  pointer extraout_RDX;
  long lVar2;
  long lVar3;
  math *this;
  float fVar4;
  span<const_float,__1L> input;
  storage_type<gsl::details::extent_type<512L>_> local_98;
  storage_type<gsl::details::extent_type<512L>_> local_90;
  storage_type<gsl::details::extent_type<512L>_> local_88;
  undefined1 local_80 [16];
  storage_type<gsl::details::extent_type<512L>_> *local_70;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  storage_type<gsl::details::extent_type<512L>_> *local_50;
  undefined8 local_48;
  storage_type<gsl::details::extent_type<512L>_> *local_40;
  undefined8 local_38;
  
  lVar2 = 0;
  local_98 = thresh.storage_.data_;
  local_90 = in.storage_.data_;
  local_88 = out.storage_.data_;
  do {
    lVar3 = lVar2 - radius;
    if (lVar2 - radius < 1) {
      lVar3 = 0;
    }
    pmVar1 = (math *)(0x200 - lVar3);
    this = pmVar1;
    if ((long)(radius * 2) < (long)pmVar1) {
      this = (math *)(radius * 2);
    }
    if ((long)(radius + lVar2) < (long)this) {
      this = (math *)(radius + lVar2);
    }
    if (this == (math *)0xffffffffffffffff) {
      this = pmVar1;
    }
    input.storage_.super_extent_type<_1L>.size_ = (index_type)(local_90.data_ + lVar3);
    input.storage_.data_ = (pointer)thresh.storage_.data_;
    fVar4 = mean<float,_1l>(this,input);
    local_98.data_[lVar2] = fVar4;
    lVar2 = lVar2 + 1;
    thresh.storage_.data_ =
         (storage_type<gsl::details::extent_type<512L>_>)
         (storage_type<gsl::details::extent_type<512L>_>)extraout_RDX;
  } while (lVar2 != 0x200);
  local_50 = &local_90;
  local_38 = 0;
  local_48 = 0x200;
  local_58 = 0;
  local_70 = &local_88;
  local_68 = 0;
  local_60 = (undefined1 *)&local_98;
  local_40 = local_50;
  ::std::
  transform<gsl::details::span_iterator<gsl::span<float_const,512l>,false>,gsl::details::span_iterator<gsl::span<float,512l>,false>,gsl::details::span_iterator<gsl::span<float,512l>,false>,re::math::threshold_reference<float,512l,512l,512l>(gsl::span<float_const,512l>,gsl::span<float,512l>,gsl::span<float,512l>,long)::_lambda(auto:1,auto:2)_1_>
            (local_80);
  return;
}

Assistant:

void threshold_reference(
    gsl::span<T const, N_in> in,
    gsl::span<T, N_out> out,
    gsl::span<T, N_thresh> thresh,
    int_t radius
) noexcept {
    assert(
        std::size(in) == std::size(out)
        && std::size(out) == std::size(thresh)
    );
    auto const n = std::size(in);

    for (int_t i = 0; i < n; ++i) {
        auto offset = std::max(i - radius, int_t{0});
        auto count = std::min(n - offset, 2*radius);
        count = std::min(count, i + radius);
        thresh[i] = mean(in.subspan(offset, count));
    }

    std::transform(
        std::cbegin(in),
        std::cend(in),
        std::cbegin(thresh),
        std::begin(out),
        [] (auto value, auto threshold) {
            return std::fdim(value, threshold);
        }
    );
}